

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::TestSuite::TestSuite
          (TestSuite *this,char *a_name,char *a_type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  allocator local_29;
  
  this->_vptr_TestSuite = (_func_int **)&PTR__TestSuite_001433a8;
  std::__cxx11::string::string((string *)&this->name_,a_name,&local_29);
  if (a_type_param == (char *)0x0) {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar1->_M_dataplus)._M_p = (pointer)&pbVar1->field_2;
    sVar2 = strlen(a_type_param);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pbVar1,a_type_param,a_type_param + sVar2);
  }
  (this->type_param_)._M_t.
  super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = pbVar1;
  (this->test_info_list_).
  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->test_info_list_).
  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->test_info_list_).
  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->set_up_tc_ = set_up_tc;
  this->tear_down_tc_ = tear_down_tc;
  this->should_run_ = false;
  this->start_timestamp_ = 0;
  this->elapsed_time_ = 0;
  internal::Mutex::Mutex(&(this->ad_hoc_test_result_).test_properites_mutex_);
  (this->ad_hoc_test_result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ad_hoc_test_result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ad_hoc_test_result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ad_hoc_test_result_).test_properties_.
  super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ad_hoc_test_result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ad_hoc_test_result_).test_part_results_.
  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ad_hoc_test_result_).death_test_count_ = 0;
  (this->ad_hoc_test_result_).start_timestamp_ = 0;
  (this->ad_hoc_test_result_).elapsed_time_ = 0;
  return;
}

Assistant:

TestSuite::TestSuite(const char* a_name, const char* a_type_param,
                     internal::SetUpTestSuiteFunc set_up_tc,
                     internal::TearDownTestSuiteFunc tear_down_tc)
    : name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      set_up_tc_(set_up_tc),
      tear_down_tc_(tear_down_tc),
      should_run_(false),
      start_timestamp_(0),
      elapsed_time_(0) {}